

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

int fits_read_rgnfile(char *filename,WCSdata *wcs,SAORegion **Rgn,int *status)

{
  int iVar1;
  int *in_RCX;
  int tstatus;
  fitsfile *fptr;
  int *in_stack_000000d0;
  SAORegion **in_stack_000000d8;
  WCSdata *in_stack_000000e0;
  char *in_stack_000000e8;
  int *in_stack_000007f8;
  SAORegion **in_stack_00000800;
  WCSdata *in_stack_00000808;
  fitsfile *in_stack_00000810;
  int *in_stack_000034e0;
  int in_stack_000034ec;
  char *in_stack_000034f0;
  fitsfile **in_stack_000034f8;
  undefined4 local_4;
  
  if (*in_RCX == 0) {
    ffpmrk();
    iVar1 = ffopen(in_stack_000034f8,in_stack_000034f0,in_stack_000034ec,in_stack_000034e0);
    if (iVar1 == 0) {
      fits_read_fits_region(in_stack_00000810,in_stack_00000808,in_stack_00000800,in_stack_000007f8)
      ;
    }
    else {
      ffcmrk();
      fits_read_ascii_region
                (in_stack_000000e8,in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
    }
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int fits_read_rgnfile( const char *filename,
            WCSdata    *wcs,
            SAORegion  **Rgn,
            int        *status )
/*  Read regions from either a FITS or ASCII region file and return the information     */
/*  in the "SAORegion" structure.  If it is nonNULL, use wcs to convert the  */
/*  region coordinates to pixels.  Return an error if region is in degrees   */
/*  but no WCS data is provided.                                             */
/*---------------------------------------------------------------------------*/
{
  fitsfile *fptr;
  int tstatus = 0;

  if( *status ) return( *status );

  /* try to open as a FITS file - if that doesn't work treat as an ASCII file */

  fits_write_errmark();
  if ( ffopen(&fptr, filename, READONLY, &tstatus) ) {
    fits_clear_errmark();
    fits_read_ascii_region(filename, wcs, Rgn, status);
  } else {
    fits_read_fits_region(fptr, wcs, Rgn, status);
  }

  return(*status);

}